

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_binbuf.c
# Opt level: O0

void binbuf_text(_binbuf *x,char *text,size_t size)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  char *pcVar6;
  t_symbol *ptVar7;
  char *pcVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  double dVar14;
  int expon;
  int plusminus;
  int minus;
  int dot;
  int digit;
  int dollar;
  int lastslash;
  int slash;
  int floatstate;
  int iStack_448;
  char c;
  int type;
  int natom;
  int nalloc;
  t_atom *ap;
  char *etext;
  char *textp;
  char *ebuf;
  char *bufp;
  char buf [1001];
  size_t size_local;
  char *text_local;
  _binbuf *x_local;
  
  pcVar6 = text + size;
  type = 0x10;
  iStack_448 = 0;
  binbuf_clear(x);
  iVar5 = binbuf_resize(x,0x10);
  if (iVar5 != 0) {
    _natom = x->b_vec;
    etext = text;
    do {
      while( true ) {
        bVar9 = false;
        if ((((etext != pcVar6) && (bVar9 = true, *etext != ' ')) && (bVar9 = true, *etext != '\n'))
           && (bVar9 = true, *etext != '\r')) {
          bVar9 = *etext == '\t';
        }
        if (!bVar9) break;
        etext = etext + 1;
      }
      if (etext == pcVar6) break;
      if (*etext == ';') {
        _natom->a_type = A_SEMI;
        (_natom->a_w).w_float = 0.0;
        etext = etext + 1;
      }
      else if (*etext == ',') {
        _natom->a_type = A_COMMA;
        (_natom->a_w).w_float = 0.0;
        etext = etext + 1;
      }
      else {
        lastslash = 0;
        bVar9 = false;
        bVar4 = false;
        ebuf = (char *)&bufp;
        do {
          pcVar8 = etext + 1;
          cVar1 = *etext;
          *ebuf = cVar1;
          bVar10 = cVar1 == '\\';
          if (-1 < lastslash) {
            bVar2 = cVar1 < '0';
            bVar3 = '9' < cVar1;
            bVar11 = cVar1 != '.';
            bVar12 = cVar1 != 'e';
            bVar13 = cVar1 != 'E';
            if (lastslash == 0) {
              if (cVar1 != '-') {
                if (bVar2 || bVar3) {
                  if (bVar11) {
                    lastslash = -1;
                  }
                  else {
                    lastslash = 3;
                  }
                }
                else {
                  lastslash = 2;
                }
              }
              else {
                lastslash = 1;
              }
            }
            else if (lastslash == 1) {
              if (bVar2 || bVar3) {
                if (bVar11) {
                  lastslash = -1;
                }
                else {
                  lastslash = 3;
                }
              }
              else {
                lastslash = 2;
              }
            }
            else if (lastslash == 2) {
              if (bVar11) {
                if (bVar12 && bVar13) {
                  if (bVar2 || bVar3) {
                    lastslash = -1;
                  }
                }
                else {
                  lastslash = 6;
                }
              }
              else {
                lastslash = 4;
              }
            }
            else if (lastslash == 3) {
              if (bVar2 || bVar3) {
                lastslash = -1;
              }
              else {
                lastslash = 5;
              }
            }
            else if (lastslash == 4) {
              if (bVar2 || bVar3) {
                if (bVar12 && bVar13) {
                  lastslash = -1;
                }
                else {
                  lastslash = 6;
                }
              }
              else {
                lastslash = 5;
              }
            }
            else if (lastslash == 5) {
              if (bVar12 && bVar13) {
                if (bVar2 || bVar3) {
                  lastslash = -1;
                }
              }
              else {
                lastslash = 6;
              }
            }
            else if (lastslash == 6) {
              if (cVar1 != '-' && cVar1 != '+') {
                if (bVar2 || bVar3) {
                  lastslash = -1;
                }
                else {
                  lastslash = 8;
                }
              }
              else {
                lastslash = 7;
              }
            }
            else if (lastslash == 7) {
              if (bVar2 || bVar3) {
                lastslash = -1;
              }
              else {
                lastslash = 8;
              }
            }
            else if ((lastslash == 8) && (bVar2 || bVar3)) {
              lastslash = -1;
            }
          }
          if (((!bVar9) && (cVar1 == '$')) &&
             ((pcVar8 != pcVar6 && (('/' < *pcVar8 && (*pcVar8 < ':')))))) {
            bVar4 = true;
          }
          if (bVar10) {
            if (bVar9) {
              ebuf = ebuf + 1;
            }
            bVar9 = !bVar9 && bVar10;
          }
          else {
            ebuf = ebuf + 1;
            bVar9 = bVar10;
          }
          bVar10 = false;
          if (((((pcVar8 != pcVar6) && (bVar10 = false, ebuf != buf + 0x3e0)) &&
               (bVar10 = true, !bVar9)) &&
              ((bVar10 = false, *pcVar8 != ' ' && (bVar10 = false, *pcVar8 != '\n')))) &&
             ((bVar10 = false, *pcVar8 != '\r' &&
              ((bVar10 = false, *pcVar8 != '\t' && (bVar10 = false, *pcVar8 != ',')))))) {
            bVar10 = *pcVar8 != ';';
          }
          etext = pcVar8;
        } while (bVar10);
        *ebuf = '\0';
        if ((((lastslash == 2) || (lastslash == 4)) || (lastslash == 5)) || (lastslash == 8)) {
          _natom->a_type = A_FLOAT;
          dVar14 = atof((char *)&bufp);
          (_natom->a_w).w_float = (float)dVar14;
        }
        else if (bVar4) {
          if ((char)bufp != '$') {
            bVar4 = false;
          }
          for (ebuf = (char *)((long)&bufp + 1); *ebuf != '\0'; ebuf = ebuf + 1) {
            if ((*ebuf < '0') || ('9' < *ebuf)) {
              bVar4 = false;
            }
          }
          if (bVar4) {
            _natom->a_type = A_DOLLAR;
            iVar5 = atoi((char *)((long)&bufp + 1));
            (_natom->a_w).w_index = iVar5;
          }
          else {
            _natom->a_type = A_DOLLSYM;
            ptVar7 = gensym((char *)&bufp);
            (_natom->a_w).w_symbol = ptVar7;
          }
        }
        else {
          _natom->a_type = A_SYMBOL;
          ptVar7 = gensym((char *)&bufp);
          (_natom->a_w).w_symbol = ptVar7;
        }
      }
      _natom = _natom + 1;
      iStack_448 = iStack_448 + 1;
      if (iStack_448 == type) {
        iVar5 = binbuf_resize(x,type << 1);
        if (iVar5 == 0) break;
        type = type << 1;
        _natom = x->b_vec + iStack_448;
      }
    } while (etext != pcVar6);
    binbuf_resize(x,iStack_448);
  }
  return;
}

Assistant:

void binbuf_text(t_binbuf *x, const char *text, size_t size)
{
    char buf[MAXPDSTRING+1], *bufp, *ebuf = buf+MAXPDSTRING;
    const char *textp = text, *etext = text+size;
    t_atom *ap;
    int nalloc = 16, natom = 0;
    binbuf_clear(x);
    if (!binbuf_resize(x, nalloc)) return;
    ap = x->b_vec;
    while (1)
    {
        int type;
            /* skip leading space */
        while ((textp != etext) && (*textp == ' ' || *textp == '\n'
            || *textp == '\r' || *textp == '\t')) textp++;
        if (textp == etext) break;
        if (*textp == ';') SETSEMI(ap), textp++;
        else if (*textp == ',') SETCOMMA(ap), textp++;
        else
        {
                /* it's an atom other than a comma or semi */
            char c;
            int floatstate = 0, slash = 0, lastslash = 0, dollar = 0;
            bufp = buf;
            do
            {
                c = *bufp = *textp++;
                lastslash = slash;
                slash = (c == '\\');

                if (floatstate >= 0)
                {
                    int digit = (c >= '0' && c <= '9'),
                        dot = (c == '.'), minus = (c == '-'),
                        plusminus = (minus || (c == '+')),
                        expon = (c == 'e' || c == 'E');
                    if (floatstate == 0)    /* beginning */
                    {
                        if (minus) floatstate = 1;
                        else if (digit) floatstate = 2;
                        else if (dot) floatstate = 3;
                        else floatstate = -1;
                    }
                    else if (floatstate == 1)   /* got minus */
                    {
                        if (digit) floatstate = 2;
                        else if (dot) floatstate = 3;
                        else floatstate = -1;
                    }
                    else if (floatstate == 2)   /* got digits */
                    {
                        if (dot) floatstate = 4;
                        else if (expon) floatstate = 6;
                        else if (!digit) floatstate = -1;
                    }
                    else if (floatstate == 3)   /* got '.' without digits */
                    {
                        if (digit) floatstate = 5;
                        else floatstate = -1;
                    }
                    else if (floatstate == 4)   /* got '.' after digits */
                    {
                        if (digit) floatstate = 5;
                        else if (expon) floatstate = 6;
                        else floatstate = -1;
                    }
                    else if (floatstate == 5)   /* got digits after . */
                    {
                        if (expon) floatstate = 6;
                        else if (!digit) floatstate = -1;
                    }
                    else if (floatstate == 6)   /* got 'e' */
                    {
                        if (plusminus) floatstate = 7;
                        else if (digit) floatstate = 8;
                        else floatstate = -1;
                    }
                    else if (floatstate == 7)   /* got plus or minus */
                    {
                        if (digit) floatstate = 8;
                        else floatstate = -1;
                    }
                    else if (floatstate == 8)   /* got digits */
                    {
                        if (!digit) floatstate = -1;
                    }
                }
                if (!lastslash && c == '$' && (textp != etext &&
                    textp[0] >= '0' && textp[0] <= '9'))
                        dollar = 1;
                if (!slash) bufp++;
                else if (lastslash)
                {
                    bufp++;
                    slash = 0;
                }
            }
            while (textp != etext && bufp != ebuf &&
                (slash || (*textp != ' ' && *textp != '\n' && *textp != '\r'
                    && *textp != '\t' &&*textp != ',' && *textp != ';')));
            *bufp = 0;
#if 0
            post("binbuf_text: buf %s", buf);
#endif
            if (floatstate == 2 || floatstate == 4 || floatstate == 5 ||
                floatstate == 8)
                    SETFLOAT(ap, atof(buf));
                /* LATER try to figure out how to mix "$" and "\$" correctly;
                here, the backslashes were already stripped so we assume all
                "$" chars are real dollars.  In fact, we only know at least one
                was. */
            else if (dollar)
            {
                if (buf[0] != '$')
                    dollar = 0;
                for (bufp = buf+1; *bufp; bufp++)
                    if (*bufp < '0' || *bufp > '9')
                        dollar = 0;
                if (dollar)
                    SETDOLLAR(ap, atoi(buf+1));
                else SETDOLLSYM(ap, gensym(buf));
            }
            else SETSYMBOL(ap, gensym(buf));
        }
        ap++;
        natom++;
        if (natom == nalloc)
        {
            if (!binbuf_resize(x, nalloc*2)) break;
            nalloc = nalloc * 2;
            ap = x->b_vec + natom;
        }
        if (textp == etext) break;
    }
    /* reallocate the vector to exactly the right size */
    binbuf_resize(x, natom);
}